

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

clock_t __thiscall trackerboy::apu::Sweep::clock(Sweep *this)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 in_RAX;
  byte bVar5;
  uint uVar6;
  uint16_t *in_RSI;
  ulong uVar4;
  
  bVar1 = this->mTime;
  if ((bVar1 != 0) && (bVar5 = this->mCounter + 1, this->mCounter = bVar5, bVar1 <= bVar5)) {
    this->mCounter = '\0';
    if (this->mShift != 0) {
      uVar3 = this->mShadow;
      uVar2 = uVar3 >> (this->mShift & 0x1f);
      if (this->mSubtraction == true) {
        uVar3 = uVar3 - uVar2;
        uVar4 = (ulong)uVar3;
        if ((short)uVar3 < 0) {
          return uVar4;
        }
      }
      else {
        uVar6 = (uint)uVar2 + (uint)uVar3;
        uVar4 = (ulong)uVar6;
        if (0x7ff < (short)uVar6) {
          *(undefined1 *)(in_RSI + 2) = 0;
          return uVar4;
        }
      }
      *in_RSI = (uint16_t)uVar4;
      *(int *)(in_RSI + 6) = (int)(uVar4 & 0xffff) * -4 + 0x2000;
      this->mShadow = (uint16_t)uVar4;
      return uVar4 & 0xffff;
    }
  }
  return CONCAT71((int7)((ulong)in_RAX >> 8),bVar1);
}

Assistant:

void Sweep::clock(PulseChannel &ch1) noexcept {
    if (mTime) {
        if (++mCounter >= mTime) {
            mCounter = 0;
            if (mShift) {
                int16_t sweepfreq = mShadow >> mShift;
                if (mSubtraction) {
                    sweepfreq = mShadow - sweepfreq;
                    if (sweepfreq < 0) {
                        return; // no change
                    }
                } else {
                    sweepfreq = mShadow + sweepfreq;
                    if (sweepfreq > GB_MAX_FREQUENCY) {
                        // sweep will overflow, disable the channel
                        ch1.disable();
                        return;
                    }
                }
                // no overflow/underflow
                // write-back the shadow register to CH1's frequency register
                ch1.setFrequency((uint16_t)sweepfreq);
                mShadow = sweepfreq;
            }
        }
    }
}